

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::run(Session *this)

{
  int iVar1;
  Config *config;
  size_t sVar2;
  unsigned_long *puVar3;
  undefined1 local_50 [8];
  Option<unsigned_long> listed;
  
  iVar1 = 0;
  if ((this->m_configData).showHelp == false) {
    Session::config(this);
    seedRng((IConfig *)(this->m_config).m_p);
    if ((this->m_configData).filenamesAsTags == true) {
      applyFilenamesAsTags((IConfig *)(this->m_config).m_p);
    }
    config = Session::config(this);
    local_50 = (undefined1  [8])0x0;
    if ((config->m_data).listTests == true) {
      listed.nullableValue = (unsigned_long *)listTests(config);
      local_50 = (undefined1  [8])&listed;
    }
    if ((config->m_data).listTestNamesOnly == true) {
      if (local_50 == (undefined1  [8])0x0) {
        puVar3 = (unsigned_long *)0x0;
      }
      else {
        puVar3 = *(unsigned_long **)local_50;
      }
      sVar2 = listTestsNamesOnly(config);
      listed.nullableValue = (unsigned_long *)(sVar2 + (long)puVar3);
      local_50 = (undefined1  [8])&listed;
    }
    if ((config->m_data).listTags == true) {
      if (local_50 == (undefined1  [8])0x0) {
        puVar3 = (unsigned_long *)0x0;
      }
      else {
        puVar3 = *(unsigned_long **)local_50;
      }
      sVar2 = listTags(config);
      listed.nullableValue = (unsigned_long *)(sVar2 + (long)puVar3);
      local_50 = (undefined1  [8])&listed;
    }
    if ((config->m_data).listReporters == true) {
      if (local_50 == (undefined1  [8])0x0) {
        puVar3 = (unsigned_long *)0x0;
      }
      else {
        puVar3 = *(unsigned_long **)local_50;
      }
      sVar2 = listReporters(config);
      listed.nullableValue = (unsigned_long *)(sVar2 + (long)puVar3);
      local_50 = (undefined1  [8])&listed;
    }
    if (local_50 == (undefined1  [8])0x0) {
      runTests((Totals *)local_50,&this->m_config);
      iVar1 = (int)listed.nullableValue;
    }
    else {
      iVar1 = *(int *)(unsigned_long **)local_50;
    }
  }
  return iVar1;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                seedRng( *m_config );

                if( m_configData.filenamesAsTags )
                    applyFilenamesAsTags( *m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runTests( m_config ).assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }